

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O0

void exit_signal_handler(int signum)

{
  int iVar1;
  int *piVar2;
  int old_errno;
  int signum_local;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  if (got_exit_signal == 0) {
    got_exit_signal = 1;
    exit_signal = signum;
  }
  signal(signum,exit_signal_handler);
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return;
}

Assistant:

static RETSIGTYPE exit_signal_handler(int signum)
{
  int old_errno = errno;
  if(got_exit_signal == 0) {
    got_exit_signal = 1;
    exit_signal = signum;
  }
  (void)signal(signum, exit_signal_handler);
  errno = old_errno;
}